

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuklib_integer.h
# Opt level: O0

uint32_t aligned_read32ne(uint8_t *buf)

{
  uint32_t num;
  uint8_t *buf_local;
  
  return *(uint32_t *)buf;
}

Assistant:

static inline uint32_t
aligned_read32ne(const uint8_t *buf)
{
#if defined(TUKLIB_USE_UNSAFE_TYPE_PUNNING) \
		|| defined(TUKLIB_USE_UNSAFE_ALIGNED_READS)
	return *(const uint32_t *)buf;
#else
	uint32_t num;
	tuklib_memcpy_aligned(&num, buf, sizeof(num));
	return num;
#endif
}